

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

int __thiscall
TPZMatrix<std::complex<long_double>_>::AddSub
          (TPZMatrix<std::complex<long_double>_> *this,int64_t sRow,int64_t sCol,
          TPZFMatrix<std::complex<long_double>_> *A)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  longdouble lVar5;
  longdouble lVar6;
  complex<long_double> __r;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined2 uStack_90;
  undefined2 uStack_8e;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined2 uStack_80;
  undefined2 uStack_7e;
  undefined4 uStack_7c;
  longdouble local_78;
  longdouble local_68;
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  
  lVar4 = (this->super_TPZBaseMatrix).fRow - sRow;
  lVar2 = (A->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fRow;
  lVar1 = (A->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.fCol;
  if (lVar2 < lVar4) {
    lVar4 = lVar2;
  }
  lVar2 = (this->super_TPZBaseMatrix).fCol - sCol;
  if (lVar1 < lVar2) {
    lVar2 = lVar1;
  }
  if (0 < lVar4) {
    lVar1 = 0;
    do {
      if (0 < lVar2) {
        lVar3 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_58,this,sRow,sCol + lVar3);
          (*(A->super_TPZMatrix<std::complex<long_double>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0x24])(&local_78,A,lVar1,lVar3);
          uStack_90 = (undefined2)uStack_50;
          uStack_8e = (undefined2)((uint)uStack_50 >> 0x10);
          uStack_8c = uStack_4c;
          uStack_80 = (undefined2)uStack_40;
          uStack_7e = (undefined2)((uint)uStack_40 >> 0x10);
          uStack_7c = uStack_3c;
          lVar6 = (longdouble)CONCAT28(uStack_90,CONCAT44(uStack_54,local_58)) + local_78;
          lVar5 = (longdouble)CONCAT28(uStack_80,CONCAT44(uStack_44,local_48)) + local_68;
          local_98 = SUB104(lVar6,0);
          uStack_94 = (undefined4)((unkuint10)lVar6 >> 0x20);
          uStack_90 = (undefined2)((unkuint10)lVar6 >> 0x40);
          local_88 = SUB104(lVar5,0);
          uStack_84 = (undefined4)((unkuint10)lVar5 >> 0x20);
          uStack_80 = (undefined2)((unkuint10)lVar5 >> 0x40);
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x23])
                    (this,sRow,sCol + lVar3,&local_98);
          lVar3 = lVar3 + 1;
        } while (lVar2 != lVar3);
      }
      lVar1 = lVar1 + 1;
      sRow = sRow + 1;
    } while (lVar1 != lVar4);
  }
  return 1;
}

Assistant:

const TPZFMatrix<TVar> TPZMatrix<TVar>::Storage() const
{
  const auto size = Size();
  const auto elem = Elem();
	TPZFMatrix<TVar> ref(size,1,const_cast<TVar*>(elem),size);
	return ref;
}